

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_segwit_tests.cpp
# Opt level: O0

void __thiscall
script_segwit_tests::IsPayToWitnessScriptHash_Invalid_Size::test_method
          (IsPayToWitnessScriptHash_Invalid_Size *this)

{
  span<const_unsigned_char,_18446744073709551615UL> b;
  const_string *file;
  long in_FS_OFFSET;
  CScript notp2wsh;
  uint160 dummy;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  const_string *msg;
  undefined1 *line_num;
  CScript *in_stack_ffffffffffffff00;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff08;
  const_string local_e0 [2];
  lazy_ostream local_c0 [2];
  assertion_result local_a0 [4];
  undefined1 local_40 [24];
  long lVar1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uint160::uint160((uint160 *)in_stack_fffffffffffffec8);
  line_num = local_40;
  CScript::CScript((CScript *)in_stack_fffffffffffffec8);
  file = (const_string *)
         CScript::operator<<(in_stack_ffffffffffffff00,(opcodetype)((ulong)line_num >> 0x20));
  ToByteVector<uint160>((uint160 *)in_stack_ffffffffffffff08._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  b._M_extent._M_extent_value = in_stack_ffffffffffffff08._M_extent_value;
  b._M_ptr = (pointer)file;
  CScript::operator<<((CScript *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),b);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
               (pointer)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               (unsigned_long)in_stack_fffffffffffffec8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffec8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffff08._M_extent_value,file,(size_t)line_num,
               msg);
    CScript::IsPayToWitnessScriptHash
              ((CScript *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
               (bool)in_stack_fffffffffffffed7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
               (pointer)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               (unsigned_long)in_stack_fffffffffffffec8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffec8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
               (pointer)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               (unsigned_long)in_stack_fffffffffffffec8);
    in_stack_fffffffffffffec8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_a0,local_c0,local_e0,0x25,CHECK,CHECK_PRED)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffec8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffec8);
    in_stack_fffffffffffffedf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffedf);
  CScript::~CScript((CScript *)in_stack_fffffffffffffec8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(IsPayToWitnessScriptHash_Invalid_Size)
{
    uint160 dummy;
    CScript notp2wsh;
    notp2wsh << OP_0 << ToByteVector(dummy);
    BOOST_CHECK(!notp2wsh.IsPayToWitnessScriptHash());
}